

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

Limit __thiscall
google::protobuf::io::CodedInputStream::PushLimit(CodedInputStream *this,int byte_limit)

{
  Limit LVar1;
  bool bVar2;
  int iVar3;
  int in_ESI;
  CodedInputStream *in_RDI;
  Limit old_limit;
  int current_position;
  
  iVar3 = CurrentPosition(in_RDI);
  LVar1 = in_RDI->current_limit_;
  bVar2 = false;
  if ((-1 < in_ESI) && (bVar2 = false, in_ESI <= 0x7fffffff - iVar3)) {
    bVar2 = in_ESI < in_RDI->current_limit_ - iVar3;
  }
  if (bVar2) {
    in_RDI->current_limit_ = iVar3 + in_ESI;
    RecomputeBufferLimits(in_RDI);
  }
  return LVar1;
}

Assistant:

CodedInputStream::Limit CodedInputStream::PushLimit(int byte_limit) {
  // Current position relative to the beginning of the stream.
  int current_position = CurrentPosition();

  Limit old_limit = current_limit_;

  // security: byte_limit is possibly evil, so check for negative values
  // and overflow. Also check that the new requested limit is before the
  // previous limit; otherwise we continue to enforce the previous limit.
  if (PROTOBUF_PREDICT_TRUE(byte_limit >= 0 &&
                            byte_limit <= INT_MAX - current_position &&
                            byte_limit < current_limit_ - current_position)) {
    current_limit_ = current_position + byte_limit;
    RecomputeBufferLimits();
  }

  return old_limit;
}